

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MathOp.cpp
# Opt level: O1

void __thiscall MathOp::Div_Const_Trunc::forward(Div_Const_Trunc *this)

{
  int *piVar1;
  int iVar2;
  bool bVar3;
  Mat MStack_38;
  
  Op::reinit(&this->super_Op);
  iVar2 = (this->super_Op).forwardRound;
  if (iVar2 == 2) {
    (**(this->div2mP->super_Op)._vptr_Op)();
    bVar3 = Op::forwardHasNext(&this->div2mP->super_Op);
    if (bVar3) {
      piVar1 = &(this->super_Op).forwardRound;
      *piVar1 = *piVar1 + -1;
    }
  }
  else if (iVar2 == 1) {
    Mat::operator*(&MStack_38,this->a,&this->b);
    Mat::operator=(this->res,&MStack_38);
    Mat::~Mat(&MStack_38);
  }
  return;
}

Assistant:

void MathOp::Div_Const_Trunc::forward() {
    reinit();
    switch (forwardRound) {
        case 1:
//            *res = (*a * (IE / b));
            *res = *a * b;
            break;
        case 2:
            div2mP->forward();
            if (div2mP->forwardHasNext()) {
                forwardRound--;
            }
            break;
    }
}